

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O2

int Sfm_NtkPerform(Sfm_Ntk_t *p,Sfm_Par_t *pPars)

{
  Vec_Wec_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  ulong uVar7;
  
  aVar6 = Abc_Clock();
  p->timeTotal = aVar6;
  if (pPars->fVerbose != 0) {
    iVar2 = 0;
    uVar7 = 0;
    if (p->vFixed != (Vec_Str_t *)0x0) {
      uVar1 = Vec_StrSum(p->vFixed);
      uVar7 = (ulong)uVar1;
    }
    if (p->vEmpty != (Vec_Str_t *)0x0) {
      iVar2 = Vec_StrSum(p->vEmpty);
    }
    printf("Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n",
           (ulong)(uint)p->nPis,(ulong)(uint)p->nPos,(ulong)(uint)p->nNodes,
           (ulong)(uint)(p->nNodes - (int)uVar7),uVar7,iVar2);
  }
  p->pPars = pPars;
  Sfm_NtkPrepare(p);
  p_00 = &p->vFanins;
  iVar2 = Vec_WecSizeUsedLimits(p_00,p->nPis,(p->vFanins).nSize - p->nPos);
  p->nTotalNodesBeg = iVar2;
  iVar3 = Vec_WecSizeSize(p_00);
  iVar2 = p->nPis;
  iVar4 = p->nPos;
  p->nTotalEdgesBeg = iVar3 - iVar4;
  iVar3 = 0;
  do {
    if (p->nObjs <= iVar4 + iVar2) {
LAB_0044284e:
      iVar2 = Vec_WecSizeUsedLimits(p_00,p->nPis,(p->vFanins).nSize - iVar4);
      p->nTotalNodesEnd = iVar2;
      iVar2 = Vec_WecSizeSize(p_00);
      p->nTotalEdgesEnd = iVar2 - p->nPos;
      aVar6 = Abc_Clock();
      p->timeTotal = aVar6 - p->timeTotal;
      if (pPars->fVerbose != 0) {
        Sfm_NtkPrintStats(p);
      }
      return iVar3;
    }
    iVar4 = Sfm_ObjIsFixed(p,iVar2);
    if (iVar4 == 0) {
      if (p->pPars->nDepthMax != 0) {
        iVar4 = Vec_IntEntry(&p->vLevels,iVar2);
        if (p->pPars->nDepthMax < iVar4) goto LAB_004427d8;
      }
      iVar4 = Sfm_ObjFaninNum(p,iVar2);
      if (1 < iVar4) {
        iVar4 = Sfm_ObjFaninNum(p,iVar2);
        if (iVar4 < 7) {
          iVar4 = 1;
          do {
            iVar5 = Sfm_NodeResub(p,iVar2);
            iVar4 = iVar4 + -1;
          } while (iVar5 != 0);
          iVar3 = (iVar3 + 1) - (uint)(iVar4 == 0);
          if ((pPars->nNodesMax != 0) && (pPars->nNodesMax <= iVar3)) {
            iVar4 = p->nPos;
            goto LAB_0044284e;
          }
        }
      }
    }
LAB_004427d8:
    iVar2 = iVar2 + 1;
    iVar4 = p->nPos;
  } while( true );
}

Assistant:

int Sfm_NtkPerform( Sfm_Ntk_t * p, Sfm_Par_t * pPars )
{
    int i, k, Counter = 0;
    //Sfm_NtkPrint( p );
    p->timeTotal = Abc_Clock();
    if ( pPars->fVerbose )
    {
        int nFixed = p->vFixed ? Vec_StrSum(p->vFixed) : 0;
        int nEmpty = p->vEmpty ? Vec_StrSum(p->vEmpty) : 0;
        printf( "Performing MFS with %d PIs, %d POs, %d nodes (%d flexible, %d fixed, %d empty).\n", 
            p->nPis, p->nPos, p->nNodes, p->nNodes-nFixed, nFixed, nEmpty );
    }
    p->pPars = pPars;
    Sfm_NtkPrepare( p );
//    Sfm_ComputeInterpolantCheck( p );
//    return 0;
    p->nTotalNodesBeg = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesBeg = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    Sfm_NtkForEachNode( p, i )
    {
        if ( Sfm_ObjIsFixed( p, i ) )
            continue;
        if ( p->pPars->nDepthMax && Sfm_ObjLevel(p, i) > p->pPars->nDepthMax )
            continue;
        if ( Sfm_ObjFaninNum(p, i) < 2 || Sfm_ObjFaninNum(p, i) > 6 )
            continue;
        for ( k = 0; Sfm_NodeResub(p, i); k++ )
        {
//            Counter++;
//            break;
        }
        Counter += (k > 0);
        if ( pPars->nNodesMax && Counter >= pPars->nNodesMax )
            break;
    }
    p->nTotalNodesEnd = Vec_WecSizeUsedLimits( &p->vFanins, Sfm_NtkPiNum(p), Vec_WecSize(&p->vFanins) - Sfm_NtkPoNum(p) );
    p->nTotalEdgesEnd = Vec_WecSizeSize(&p->vFanins) - Sfm_NtkPoNum(p);
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
        Sfm_NtkPrintStats( p );
    //Sfm_NtkPrint( p );
    return Counter;
}